

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

char * __thiscall
sentencepiece::ModelProto::_InternalParse(ModelProto *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  Rep *pRVar3;
  bool bVar4;
  ModelProto_SentencePiece *msg;
  NormalizerSpec *pNVar5;
  SelfTestData *pSVar6;
  TrainerSpec *pTVar7;
  char cVar8;
  uint res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *ptr_00;
  Arena *pAVar9;
  pair<const_char_*,_unsigned_int> pVar10;
  byte *local_48;
  InternalMetadata *local_40;
  ExtensionSet *local_38;
  
  local_40 = &(this->super_MessageLite)._internal_metadata_;
  local_38 = &this->_extensions_;
  local_48 = (byte *)ptr;
  do {
    bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
    if (bVar4) {
      return (char *)local_48;
    }
    bVar1 = *local_48;
    res = (uint)bVar1;
    ptr_00 = local_48 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*ptr_00 * 0x80) - 0x80;
      if ((char)*ptr_00 < '\0') {
        pVar10 = google::protobuf::internal::ReadTagFallback((char *)local_48,res);
        ptr_00 = (byte *)pVar10.first;
        res = pVar10.second;
      }
      else {
        ptr_00 = local_48 + 2;
      }
    }
    local_48 = ptr_00;
    if (ptr_00 == (byte *)0x0) {
LAB_001ba4d2:
      cVar8 = '\x04';
    }
    else {
      cVar8 = (char)res;
      switch(res >> 3) {
      case 1:
        if (cVar8 == '\n') {
          local_48 = ptr_00 + -1;
          do {
            local_48 = local_48 + 1;
            pRVar3 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar3 == (Rep *)0x0) {
LAB_001ba2cd:
              google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                        (&(this->pieces_).super_RepeatedPtrFieldBase,
                         (this->pieces_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_001ba2db:
              pRVar3 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
              pRVar3->allocated_size = pRVar3->allocated_size + 1;
              msg = google::protobuf::Arena::
                    CreateMaybeMessage<sentencepiece::ModelProto_SentencePiece>
                              ((this->pieces_).super_RepeatedPtrFieldBase.arena_);
              pRVar3 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
              iVar2 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
              (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              pRVar3->elements[iVar2] = msg;
            }
            else {
              iVar2 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar3->allocated_size <= iVar2) {
                if (pRVar3->allocated_size == (this->pieces_).super_RepeatedPtrFieldBase.total_size_
                   ) goto LAB_001ba2cd;
                goto LAB_001ba2db;
              }
              (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
              msg = (ModelProto_SentencePiece *)pRVar3->elements[iVar2];
            }
            local_48 = (byte *)google::protobuf::internal::ParseContext::
                               ParseMessage<sentencepiece::ModelProto_SentencePiece>
                                         (ctx,msg,(char *)local_48);
            if (local_48 == (byte *)0x0) goto LAB_001ba4d2;
            cVar8 = '\x02';
          } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == 10));
          goto LAB_001ba4c7;
        }
        break;
      case 2:
        if (cVar8 != '\x12') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        if (this->trainer_spec_ == (TrainerSpec *)0x0) {
          pAVar9 = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
          if (((ulong)pAVar9 & 1) != 0) {
            pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
          }
          pTVar7 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::TrainerSpec>(pAVar9);
          this->trainer_spec_ = pTVar7;
        }
        local_48 = (byte *)google::protobuf::internal::ParseContext::
                           ParseMessage<sentencepiece::TrainerSpec>
                                     (ctx,this->trainer_spec_,(char *)local_48);
        goto LAB_001ba4b4;
      case 3:
        if (cVar8 == '\x1a') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          if (this->normalizer_spec_ == (NormalizerSpec *)0x0) {
            pAVar9 = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
            if (((ulong)pAVar9 & 1) != 0) {
              pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
            }
            pNVar5 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::NormalizerSpec>
                               (pAVar9);
            this->normalizer_spec_ = pNVar5;
          }
          pNVar5 = this->normalizer_spec_;
LAB_001ba3be:
          local_48 = (byte *)google::protobuf::internal::ParseContext::
                             ParseMessage<sentencepiece::NormalizerSpec>
                                       (ctx,pNVar5,(char *)local_48);
          goto LAB_001ba4b4;
        }
        break;
      case 4:
        if (cVar8 == '\"') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          if (this->self_test_data_ == (SelfTestData *)0x0) {
            pAVar9 = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
            if (((ulong)pAVar9 & 1) != 0) {
              pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
            }
            pSVar6 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::SelfTestData>
                               (pAVar9);
            this->self_test_data_ = pSVar6;
          }
          local_48 = (byte *)google::protobuf::internal::ParseContext::
                             ParseMessage<sentencepiece::SelfTestData>
                                       (ctx,this->self_test_data_,(char *)local_48);
          goto LAB_001ba4b4;
        }
        break;
      case 5:
        if (cVar8 == '*') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
          if (this->denormalizer_spec_ == (NormalizerSpec *)0x0) {
            pAVar9 = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
            if (((ulong)pAVar9 & 1) != 0) {
              pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
            }
            pNVar5 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::NormalizerSpec>
                               (pAVar9);
            this->denormalizer_spec_ = pNVar5;
          }
          pNVar5 = this->denormalizer_spec_;
          goto LAB_001ba3be;
        }
      }
      if (res == 0 || (res & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        cVar8 = '\t';
      }
      else {
        if (res < 0x640) {
          if (((ulong)local_40->ptr_ & 1) == 0) {
            unknown = google::protobuf::internal::InternalMetadata::
                      mutable_unknown_fields_slow<std::__cxx11::string>(local_40);
          }
          else {
            unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (((ulong)local_40->ptr_ & 0xfffffffffffffffe) + 8);
          }
          local_48 = (byte *)google::protobuf::internal::UnknownFieldParse
                                       (res,unknown,(char *)local_48,ctx);
        }
        else {
          local_48 = (byte *)google::protobuf::internal::ExtensionSet::ParseField
                                       (local_38,(ulong)res,(char *)ptr_00,
                                        (MessageLite *)_ModelProto_default_instance_,local_40,ctx);
        }
LAB_001ba4b4:
        cVar8 = (local_48 == (byte *)0x0) * '\x02' + '\x02';
      }
    }
LAB_001ba4c7:
    if (cVar8 != '\x02') {
      if (cVar8 == '\x04') {
        local_48 = (byte *)0x0;
      }
      return (char *)local_48;
    }
  } while( true );
}

Assistant:

const char* ModelProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .sentencepiece.ModelProto.SentencePiece pieces = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_pieces(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.TrainerSpec trainer_spec = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_trainer_spec(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.NormalizerSpec normalizer_spec = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_normalizer_spec(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.SelfTestData self_test_data = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_self_test_data(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.NormalizerSpec denormalizer_spec = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_denormalizer_spec(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}